

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.hpp
# Opt level: O3

void __thiscall
duckdb::Relation::Relation
          (Relation *this,shared_ptr<duckdb::RelationContextWrapper,_true> *context,
          RelationType type,string *alias_p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation = (_func_int **)&PTR__Relation_02442760;
  (this->context).internal.
  super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((context->internal).
         super___shared_ptr<duckdb::RelationContextWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ClientContextWrapper;
  p_Var1 = (context->internal).
           super___shared_ptr<duckdb::RelationContextWrapper,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->context).internal.
  super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->type = type;
  CreateRelationAlias(&this->alias,(duckdb *)(ulong)type,(RelationType)(alias_p->_M_dataplus)._M_p,
                      (string *)alias_p->_M_string_length);
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Relation(const shared_ptr<RelationContextWrapper> &context, RelationType type, const string &alias_p = "")
	    : context(context), type(type), alias(CreateRelationAlias(type, alias_p)) {
	}